

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* deqp::gles31::Functional::anon_unknown_1::
  join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
            *a,vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *b)

{
  const_iterator __position;
  iterator iVar1;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
  __last;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
  __first;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *this;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __first._M_current =
       (a->
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (a->
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  this = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *)(((long)(b->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(b->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
            ((long)__last._M_current - (long)__first._M_current >> 4) * -0x5555555555555555);
  if (this < (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)0x2aaaaaaaaaaaaab) {
    if (this == (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)0x0) {
      __position._M_current = (MessageFilter *)0x0;
    }
    else {
      __position._M_current =
           std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           ::_M_allocate(this,0xaaaaaaaaaaaaaaab);
      __first._M_current =
           (a->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (a->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_start = __position._M_current;
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __position._M_current + (long)this;
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
    ::
    insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
                *)__return_storage_ptr__,__position,__first,__last);
    iVar1 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
            ::
            insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
                      ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
                        *)__return_storage_ptr__,
                       (__return_storage_ptr__->
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                       (b->
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (b->
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    return (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
            *)iVar1._M_current;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

vector<T> join(const vector<T>& a, const vector<T>&b)
{
	vector<T> retval;

	retval.reserve(a.size()+b.size());
	retval.insert(retval.end(), a.begin(), a.end());
	retval.insert(retval.end(), b.begin(), b.end());
	return retval;
}